

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

int NetbufferSize(void)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint count;
  uint uVar4;
  BYTE *skipper;
  
  if ((doomcom.data[0] & 0xa0) != 0) {
    return (int)doomcom.datalength;
  }
  uVar2 = 3 - (doomcom.data[0] < 0x40);
  if (NetMode == '\x01') {
    uVar2 = uVar2 + (nodeforplayer[Net_Arbitrator] == (int)doomcom.remotenode);
  }
  count = doomcom.data[0] & 3;
  if (count == 3) {
    uVar3 = (ulong)uVar2;
    uVar2 = uVar2 + 1;
    count = doomcom.data[uVar3] + 3;
  }
  if ((doomcom.data[0] & 8) != 0) {
    uVar2 = uVar2 + doomcom.data[uVar2] + 1;
  }
  uVar3 = (ulong)uVar2 + 1;
  if ((doomcom.data[0] & 0x10) == 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = (uint)doomcom.data[(ulong)uVar2 + 1];
    uVar3 = (ulong)((int)uVar3 + (uint)doomcom.data[(ulong)uVar2 + 1]);
  }
  iVar1 = count * uVar4 * 3 + (int)uVar3;
  if (iVar1 <= doomcom.datalength) {
    skipper = doomcom.data + (uVar3 & 0xffffffff);
    for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
      SkipTicCmd(&skipper,count);
    }
    iVar1 = (int)skipper + -0x9abf44;
  }
  return iVar1;
}

Assistant:

int NetbufferSize ()
{
	if (netbuffer[0] & (NCMD_EXIT | NCMD_SETUP))
	{
		return doomcom.datalength;
	}

	int k = 2, count, numtics;

	if (netbuffer[0] & NCMD_RETRANSMIT)
		k++;

	if (NetMode == NET_PacketServer && doomcom.remotenode == nodeforplayer[Net_Arbitrator])
		k++;

	numtics = netbuffer[0] & NCMD_XTICS;
	if (numtics == 3)
	{
		numtics += netbuffer[k++];
	}

	if (netbuffer[0] & NCMD_QUITTERS)
	{
		k += netbuffer[k] + 1;
	}

	// Network delay byte
	k++;

	if (netbuffer[0] & NCMD_MULTI)
	{
		count = netbuffer[k];
		k += count;
	}
	else
	{
		count = 1;
	}

	// Need at least 3 bytes per tic per player
	if (doomcom.datalength < k + 3 * count * numtics)
	{
		return k + 3 * count * numtics;
	}

	BYTE *skipper = &netbuffer[k];
	if ((netbuffer[0] & NCMD_EXIT) == 0)
	{
		while (count-- > 0)
		{
			SkipTicCmd (&skipper, numtics);
		}
	}
	return int(skipper - netbuffer);
}